

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int mg_forward(mg_connection *c,char *addr)

{
  void **user_data;
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  ns_connection *conn;
  __int32_t **pp_Var7;
  int *piVar8;
  long lVar9;
  long lVar10;
  
  user_data = &c[-1].callback_param;
  conn = ns_connect((ns_mgr *)c[1].request_method,addr,mg_ev_handler,user_data);
  if (conn == (ns_connection *)0x0) {
    *(uint *)((long)*user_data + 0x98) = *(uint *)((long)*user_data + 0x98) | 0x10;
    return 0;
  }
  pbVar1 = (byte *)((long)&conn->flags + 2);
  *pbVar1 = *pbVar1 | 0x80;
  *(undefined4 *)&c[1].http_version = 6;
  c[1].uri = (char *)conn;
  pcVar4 = c->request_method;
  iVar6 = strcmp(pcVar4,"CONNECT");
  if (iVar6 == 0) {
    send(*(int *)((long)*user_data + 0x20),"HTTP/1.1 200 OK\r\n\r\n",0x13,0);
  }
  else {
    piVar8 = (int *)c->uri;
    if (*(int *)((long)piVar8 + 3) != 0x2f2f3a70 || *piVar8 != 0x70747468) goto LAB_001078cb;
    piVar8 = (int *)((long)piVar8 + 7);
    while( true ) {
      c->uri = (char *)piVar8;
LAB_001078cb:
      if (((char)*piVar8 == '\0') || ((char)*piVar8 == '/')) break;
      piVar8 = (int *)((long)piVar8 + 1);
    }
    ns_printf(conn,"%s %s HTTP/%s\r\n",pcVar4,piVar8,c->http_version);
    if (c->num_headers < 1) {
LAB_001079be:
      ns_printf(conn,"%s: %s\r\n","Connection","close");
    }
    else {
      bVar5 = true;
      pp_Var7 = __ctype_tolower_loc();
      lVar10 = 0;
LAB_00107920:
      do {
        pcVar4 = c->http_headers[lVar10].name;
        lVar9 = 0;
        do {
          bVar2 = pcVar4[lVar9];
          iVar6 = (*pp_Var7)[bVar2];
          iVar3 = (*pp_Var7)[(byte)"Connection"[lVar9]];
          if (bVar2 == 0) break;
          lVar9 = lVar9 + 1;
        } while (iVar6 == iVar3);
        if (iVar6 != iVar3) {
          ns_printf(conn,"%s: %s\r\n",pcVar4,c->http_headers[lVar10].value);
          lVar10 = lVar10 + 1;
          if (c->num_headers <= lVar10) {
            if (bVar5) goto LAB_001079be;
            break;
          }
          goto LAB_00107920;
        }
        bVar5 = false;
        ns_printf(conn,"%s: %s\r\n","Connection","close");
        lVar10 = lVar10 + 1;
      } while (lVar10 < c->num_headers);
    }
    ns_printf(conn,"%s","\r\n");
    ns_out(conn,c->content,(long)(int)c->content_len);
  }
  return 1;
}

Assistant:

int mg_forward(struct mg_connection *c, const char *addr) {
  static const char ok[] = "HTTP/1.1 200 OK\r\n\r\n";
  struct connection *conn = MG_CONN_2_CONN(c);
  struct ns_connection *pc;

  if ((pc = ns_connect(&conn->server->ns_mgr, addr,
      mg_ev_handler, conn)) == NULL) {
    conn->ns_conn->flags |= NSF_CLOSE_IMMEDIATELY;
    return 0;
  }

  // Interlink two connections
  pc->flags |= MG_PROXY_CONN;
  conn->endpoint_type = EP_PROXY;
  conn->endpoint.nc = pc;
  DBG(("%p [%s] [%s] -> %p %p", conn, c->uri, addr, pc, conn->ns_conn->ssl));

  if (strcmp(c->request_method, "CONNECT") == 0) {
    // For CONNECT request, reply with 200 OK. Tunnel is established.
    // TODO(lsm): check for send() failure
    (void) send(conn->ns_conn->sock, ok, sizeof(ok) - 1, 0);
  } else {
    // Strip "http://host:port" part from the URI
    if (memcmp(c->uri, "http://", 7) == 0) c->uri += 7;
    while (*c->uri != '\0' && *c->uri != '/') c->uri++;
    proxy_request(pc, c);
  }
  return 1;
}